

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_makers.hpp
# Opt level: O1

void so_5::details::handlers_bunch_basics_t::prepare_handlers
               (msg_type_and_handler_pair_t *left,msg_type_and_handler_pair_t *right)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  msg_type_and_handler_pair_t *this;
  msg_type_and_handler_pair_t *pmVar4;
  long *local_58;
  long local_48;
  long lStack_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pmVar4 = right;
  if (left != right) {
    std::
    __introsort_loop<so_5::details::msg_type_and_handler_pair_t*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (left,right,
               (int)LZCOUNT(((long)right - (long)left >> 4) * -0x5555555555555555) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<so_5::details::msg_type_and_handler_pair_t*,__gnu_cxx::__ops::_Iter_less_iter>
              (left,right);
    do {
      this = left;
      left = this + 1;
      pmVar4 = right;
      if (left == right) break;
      bVar1 = std::type_index::operator==(&this->m_msg_type,&left->m_msg_type);
      pmVar4 = this;
    } while (!bVar1);
  }
  if (pmVar4 != right) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"several handlers are defined for message; msg_type: ","");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_38);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_48 = *plVar3;
      lStack_40 = plVar2[3];
      local_58 = &local_48;
    }
    else {
      local_48 = *plVar3;
      local_58 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    exception_t::raise(0x24b165);
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return;
}

Assistant:

static inline void
		prepare_handlers(
			msg_type_and_handler_pair_t * left,
			msg_type_and_handler_pair_t * right )
			{
				std::sort( left, right );
				auto duplicate = std::adjacent_find( left, right );
				if( duplicate != right )
					SO_5_THROW_EXCEPTION( rc_several_handlers_for_one_message_type,
							std::string( "several handlers are defined for message; "
									"msg_type: " ) + duplicate->m_msg_type.name() );
			}